

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

void __thiscall mp::pre::ValuePresolverImpl::CleanUpValueNodes(ValuePresolverImpl *this)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->val_nodes_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ValueNode::CleanUpAndRealloc((ValueNode *)p_Var1[1]._M_nxt);
  }
  return;
}

Assistant:

void CleanUpValueNodes() const {
    for (auto pvn: val_nodes_)
      pvn->CleanUpAndRealloc();
  }